

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# derived_properties.c
# Opt level: O3

void release_derived_properties(derived_properties_t *dp)

{
  ulong uVar1;
  
  if (dp->count != 0) {
    uVar1 = 0;
    do {
      free(dp->name[uVar1]);
      uVar1 = uVar1 + 1;
    } while (uVar1 < dp->count);
  }
  free(dp->name);
  free(dp->begin);
  free(dp->end);
  free(dp->code_points);
  free(dp);
  return;
}

Assistant:

void release_derived_properties( struct derived_properties_t * dp )
{
    size_t i;

    for ( i = 0; i < dp->count; ++i )
    {
        free( dp->name[ i ] );
    }

    free( dp->name );
    free( dp->begin );
    free( dp->end );
    free( dp->code_points );
    free( dp );
}